

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xrbtree_test.c
# Opt level: O0

void traverse(xrbt_t *rb)

{
  mystruct_t *p;
  xrbt_iter_t iter;
  xrbt_t *rb_local;
  
  p = (mystruct_t *)xrbt_begin(rb);
  printf("traverse size = %u\n",rb->size & 0xffffffff);
  for (; p != (mystruct_t *)0x0; p = (mystruct_t *)xrbt_iter_next((xrbt_iter_t)p)) {
    printf("[%s, %d], ",p->key + 0x18,(ulong)*(uint *)(p[1].key + 0x14));
  }
  printf("\n");
  return;
}

Assistant:

void traverse(xrbt_t* rb)
{
    xrbt_iter_t iter = xrbt_begin(rb);
    mystruct_t* p;

    printf("traverse size = %u\n", (unsigned)xrbt_size(rb));
    while (iter != xrbt_end(rb))
    {
        p = xrbt_iter_data(iter);
        printf("[%s, %d], ", p->key, p->value);
        iter = xrbt_iter_next(iter);
    }
    printf("\n");
}